

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O0

void xmlParserPrintFileContextInternal
               (xmlParserInputPtr input,xmlGenericErrorFunc channel,void *data)

{
  xmlChar *__src;
  int iVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  int local_a4;
  int c;
  int len;
  xmlChar *ctnt;
  xmlChar content [81];
  uint local_3c;
  uint col;
  uint n;
  xmlChar *start;
  xmlChar *base;
  xmlChar *cur;
  void *data_local;
  xmlGenericErrorFunc channel_local;
  xmlParserInputPtr input_local;
  
  if ((input != (xmlParserInputPtr)0x0) && (input->cur != (xmlChar *)0x0)) {
    base = input->cur;
    while( true ) {
      bVar4 = false;
      if ((input->base < base) && (bVar4 = true, *base != '\n')) {
        bVar4 = *base == '\r';
      }
      if (!bVar4) break;
      base = base + -1;
    }
    local_3c = 0;
    while( true ) {
      bVar4 = false;
      if (((local_3c < 0x50) && (bVar4 = false, input->base < base)) &&
         (bVar4 = false, *base != '\n')) {
        bVar4 = *base != '\r';
      }
      if (!bVar4) break;
      base = base + -1;
      local_3c = local_3c + 1;
    }
    if ((local_3c == 0) || ((*base != '\n' && (*base != '\r')))) {
      while( true ) {
        bVar4 = false;
        if (base < input->cur) {
          bVar4 = (*base & 0xc0) == 0x80;
        }
        if (!bVar4) break;
        base = base + 1;
      }
    }
    else {
      base = base + 1;
    }
    __src = base;
    register0x00000000 = (int)input->cur - (int)base;
    local_3c = 0;
    while( true ) {
      bVar4 = false;
      if ((*base != '\0') && (bVar4 = false, *base != '\n')) {
        bVar4 = *base != '\r';
      }
      if (!bVar4) break;
      local_a4 = (int)input->end - (int)base;
      iVar1 = xmlGetUTF8Char(base,&local_a4);
      if ((iVar1 < 0) || (0x50 < local_3c + local_a4)) break;
      base = base + local_a4;
      local_3c = local_a4 + local_3c;
    }
    memcpy(&ctnt,__src,(ulong)local_3c);
    content[(ulong)local_3c - 8] = '\0';
    (*channel)(data,"%s\n",&ctnt);
    local_3c = 0;
    _c = &ctnt;
    while( true ) {
      bVar4 = false;
      if (local_3c < stack0xffffffffffffffc0) {
        uVar2 = local_3c + 1;
        bVar3 = local_3c < 0x4f;
        bVar4 = false;
        local_3c = uVar2;
        if (bVar3) {
          bVar4 = *(char *)_c != '\0';
        }
      }
      if (!bVar4) break;
      if (*(char *)_c != '\t') {
        *(char *)_c = ' ';
      }
      _c = (xmlChar **)((long)_c + 1);
    }
    *(char *)_c = '^';
    *(char *)((long)_c + 1) = '\0';
    _c = (xmlChar **)((long)_c + 1);
    (*channel)(data,"%s\n",&ctnt);
  }
  return;
}

Assistant:

static void
xmlParserPrintFileContextInternal(xmlParserInputPtr input ,
		xmlGenericErrorFunc channel, void *data ) {
    const xmlChar *cur, *base, *start;
    unsigned int n, col;	/* GCC warns if signed, because compared with sizeof() */
    xmlChar  content[81]; /* space for 80 chars + line terminator */
    xmlChar *ctnt;

    if ((input == NULL) || (input->cur == NULL))
        return;

    cur = input->cur;
    base = input->base;
    /* skip backwards over any end-of-lines */
    while ((cur > base) && ((*(cur) == '\n') || (*(cur) == '\r'))) {
	cur--;
    }
    n = 0;
    /* search backwards for beginning-of-line (to max buff size) */
    while ((n < sizeof(content) - 1) && (cur > base) &&
	   (*cur != '\n') && (*cur != '\r')) {
        cur--;
        n++;
    }
    if ((n > 0) && ((*cur == '\n') || (*cur == '\r'))) {
        cur++;
    } else {
        /* skip over continuation bytes */
        while ((cur < input->cur) && ((*cur & 0xC0) == 0x80))
            cur++;
    }
    /* calculate the error position in terms of the current position */
    col = input->cur - cur;
    /* search forward for end-of-line (to max buff size) */
    n = 0;
    start = cur;
    /* copy selected text to our buffer */
    while ((*cur != 0) && (*(cur) != '\n') && (*(cur) != '\r')) {
        int len = input->end - cur;
        int c = xmlGetUTF8Char(cur, &len);

        if ((c < 0) || (n + len > sizeof(content)-1))
            break;
        cur += len;
	n += len;
    }
    memcpy(content, start, n);
    content[n] = 0;
    /* print out the selected text */
    channel(data ,"%s\n", content);
    /* create blank line with problem pointer */
    n = 0;
    ctnt = content;
    /* (leave buffer space for pointer + line terminator) */
    while ((n<col) && (n++ < sizeof(content)-2) && (*ctnt != 0)) {
	if (*(ctnt) != '\t')
	    *(ctnt) = ' ';
	ctnt++;
    }
    *ctnt++ = '^';
    *ctnt = 0;
    channel(data ,"%s\n", content);
}